

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void serialization_pipeline<TreesIndexer,char*>(TreesIndexer *model,char **out)

{
  char *pcVar1;
  undefined8 uVar2;
  char *pcVar3;
  pointer pSVar4;
  size_t sVar5;
  long lVar6;
  SingleTreeIndex *node;
  pointer node_00;
  SignalSwitcher ss;
  SignalSwitcher local_40;
  
  SignalSwitcher::SignalSwitcher(&local_40);
  pcVar1 = *out;
  uVar2 = *(undefined8 *)incomplete_watermark;
  *(undefined8 *)(pcVar1 + 5) = *(undefined8 *)(incomplete_watermark + 5);
  *(undefined8 *)pcVar1 = uVar2;
  pcVar3 = *out;
  *out = pcVar3 + 0xd;
  pcVar3[0xd] = '\x01';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\x05';
  pcVar3[0x10] = '\x06';
  pcVar3[0x11] = '\x01';
  pcVar3[0x12] = '\x03';
  pcVar3[0x13] = '\x04';
  pcVar3[0x14] = '\b';
  pcVar3[0x15] = '\b';
  pcVar3 = *out;
  *out = pcVar3 + 9;
  pcVar3[9] = '\x05';
  pcVar3 = *out;
  *out = pcVar3 + 1;
  pSVar4 = (model->indices).super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 8;
  for (node_00 = (model->indices).
                 super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
                 super__Vector_impl_data._M_start; node_00 != pSVar4; node_00 = node_00 + 1) {
    sVar5 = get_size_node(node_00);
    lVar6 = lVar6 + sVar5;
  }
  *(long *)(pcVar3 + 1) = lVar6;
  *out = *out + 8;
  serialize_model<char*>(model,out);
  check_interrupt_switch(&local_40);
  **out = '\0';
  pcVar3 = *out;
  *out = pcVar3 + 1;
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar3 = *out;
  *out = pcVar1;
  uVar2 = *(undefined8 *)watermark;
  *(undefined8 *)(pcVar1 + 5) = *(undefined8 *)(watermark + 5);
  *(undefined8 *)pcVar1 = uVar2;
  *out = pcVar3 + 8;
  SignalSwitcher::~SignalSwitcher(&local_40);
  return;
}

Assistant:

void serialization_pipeline(const Model &model, otype &out)
{
    SignalSwitcher ss = SignalSwitcher();

    auto pos_watermark = set_return_position(out);
    
    add_setup_info(out, false);
    uint8_t model_type = get_model_code(model);
    write_bytes<uint8_t>((void*)&model_type, (size_t)1, out);
    size_t size_model = get_size_model(model);
    write_bytes<size_t>((void*)&size_model, (size_t)1, out);
    serialize_model(model, out);
    check_interrupt_switch(ss);

    /* This last bit will be left open in order to signal if anything follows,
       in case it's decided to change the format in the future or to add
       something additional, along with a 'size_t' slot in case it would need
       to jump ahead or something like that. */
    uint8_t ending_type = (uint8_t)EndsHere;
    write_bytes<uint8_t>((void*)&ending_type, (size_t)1, out);
    size_t jump_ahead = 0;
    write_bytes<size_t>((void*)&jump_ahead, (size_t)1, out);

    auto end_pos = set_return_position(out);
    return_to_position(out, pos_watermark);
    add_full_watermark(out);
    return_to_position(out, end_pos);
}